

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_zip.c
# Opt level: O3

wchar_t zip_read_data_none(archive_read *a,void **_buff,size_t *size,int64_t *offset)

{
  byte bVar1;
  void *pvVar2;
  wchar_t wVar3;
  uint8_t *data;
  char cVar4;
  uint8_t *puVar5;
  long lVar6;
  long lVar7;
  undefined1 auVar8 [16];
  size_t dsize;
  uint8_t *local_48;
  size_t *local_40;
  uint8_t *local_38;
  
  pvVar2 = a->format->data;
  cVar4 = *(char *)((long)pvVar2 + 0x1f98);
  lVar6 = -10;
  if (cVar4 == '\0') {
    lVar6 = 0;
  }
  lVar7 = 10;
  if (cVar4 == '\0') {
    lVar7 = 0;
  }
  if ((*(byte *)(*(long *)((long)pvVar2 + 0x70) + 0x7e) & 8) == 0) {
    if (*(long *)((long)pvVar2 + 0x78) == 0) {
      *(undefined1 *)((long)pvVar2 + 0xa2) = 1;
      if (cVar4 == '\0') {
        return L'\0';
      }
      data = (uint8_t *)0x0;
      goto LAB_00141d32;
    }
    data = (uint8_t *)__archive_read_ahead(a,1,(ssize_t *)&local_48);
    if ((long)local_48 < 1) goto LAB_00141cb4;
    puVar5 = *(uint8_t **)((long)pvVar2 + 0x78);
    if ((long)local_48 <= (long)*(uint8_t **)((long)pvVar2 + 0x78)) {
      puVar5 = local_48;
    }
  }
  else {
    local_40 = size;
    data = (uint8_t *)__archive_read_ahead(a,lVar7 + 0x18U,(ssize_t *)&local_48);
    if ((long)local_48 < (long)(lVar7 + 0x18U)) {
LAB_00141cb4:
      archive_set_error(&a->archive,0x54,"Truncated ZIP file data");
      return L'\xffffffe2';
    }
    if ((((data[lVar7] == 'P') && (data[lVar7 + 1] == 'K')) && (data[lVar7 + 2] == '\a')) &&
       (data[lVar7 + 3] == '\b')) {
      if (*(ulong *)((long)pvVar2 + 0x90) == (ulong)*(uint *)(data + lVar7 + 4)) {
        cVar4 = *(char *)((long)pvVar2 + 0x1f98);
      }
      else {
        cVar4 = *(char *)((long)pvVar2 + 0x1f98);
        if (*(char *)((long)pvVar2 + 0xa0) == '\0') {
          if ((cVar4 != '\0') && (*(int *)(*(long *)((long)pvVar2 + 0x70) + 0x84) == 2)) {
            *(undefined1 *)((long)pvVar2 + 0xa2) = 1;
            goto LAB_00141d32;
          }
          goto LAB_00141d81;
        }
      }
      *(undefined1 *)((long)pvVar2 + 0xa2) = 1;
      if (cVar4 == '\0') {
        return L'\0';
      }
LAB_00141d32:
      wVar3 = check_authentication_code(a,data);
      if (wVar3 == L'\0') {
        return L'\0';
      }
      return wVar3;
    }
LAB_00141d81:
    puVar5 = data + lVar7 + 1;
    while (puVar5 < data + (long)(local_48 + -4)) {
      bVar1 = puVar5[3];
      if (bVar1 < 0x4b) {
        if (bVar1 == 7) {
          puVar5 = puVar5 + 1;
        }
        else {
          if (((bVar1 == 8) && (puVar5[2] == '\a')) && ((puVar5[1] == 'K' && (*puVar5 == 'P'))))
          break;
LAB_00141dce:
          puVar5 = puVar5 + 4;
        }
      }
      else if (bVar1 == 0x50) {
        puVar5 = puVar5 + 3;
      }
      else {
        if (bVar1 != 0x4b) goto LAB_00141dce;
        puVar5 = puVar5 + 2;
      }
    }
    size = local_40;
    puVar5 = puVar5 + (lVar6 - (long)data);
  }
  local_48 = puVar5;
  puVar5 = local_48;
  if (*(char *)((long)pvVar2 + 0x1f2c) == '\0') {
    if (*(char *)((long)pvVar2 + 0x1f88) == '\0') goto LAB_00141e7b;
    if (*(uint8_t **)((long)pvVar2 + 0x1f08) <= local_48) {
      puVar5 = *(uint8_t **)((long)pvVar2 + 0x1f08);
    }
    local_38 = puVar5;
    __hmac_sha1_update((archive_hmac_sha1_ctx *)((long)pvVar2 + 0x1f90),data,(size_t)puVar5);
    aes_ctr_update((archive_crypto_ctx *)((long)pvVar2 + 0x1f30),data,(size_t)puVar5,
                   *(uint8_t **)((long)pvVar2 + 0x1ef8),(size_t *)&local_38);
  }
  else {
    if (*(uint8_t **)((long)pvVar2 + 0x1f08) <= local_48) {
      puVar5 = *(uint8_t **)((long)pvVar2 + 0x1f08);
    }
    trad_enc_decrypt_update
              ((trad_enc_ctx *)((long)pvVar2 + 0x1f20),data,(size_t)puVar5,
               *(uint8_t **)((long)pvVar2 + 0x1ef8),(size_t)puVar5);
  }
  data = *(uint8_t **)((long)pvVar2 + 0x1ef8);
  local_48 = puVar5;
LAB_00141e7b:
  *(long *)((long)pvVar2 + 0x78) = *(long *)((long)pvVar2 + 0x78) - (long)local_48;
  auVar8._8_4_ = (int)local_48;
  auVar8._0_8_ = local_48;
  auVar8._12_4_ = (int)((ulong)local_48 >> 0x20);
  *(uint8_t **)((long)pvVar2 + 0x80) = local_48 + *(long *)((long)pvVar2 + 0x80);
  *(long *)((long)pvVar2 + 0x88) = auVar8._8_8_ + *(long *)((long)pvVar2 + 0x88);
  *(long *)((long)pvVar2 + 0x68) = (long)(local_48 + *(long *)((long)pvVar2 + 0x68));
  *size = (size_t)local_48;
  *_buff = data;
  return L'\0';
}

Assistant:

static int
zip_read_data_none(struct archive_read *a, const void **_buff,
    size_t *size, int64_t *offset)
{
	struct zip *zip;
	const char *buff;
	ssize_t bytes_avail;
	ssize_t trailing_extra;
	int r;

	(void)offset; /* UNUSED */

	zip = (struct zip *)(a->format->data);
	trailing_extra = zip->hctx_valid ? AUTH_CODE_SIZE : 0;

	if (zip->entry->zip_flags & ZIP_LENGTH_AT_END) {
		const char *p;
		ssize_t grabbing_bytes = 24 + trailing_extra;

		/* Grab at least 24 bytes. */
		buff = __archive_read_ahead(a, grabbing_bytes, &bytes_avail);
		if (bytes_avail < grabbing_bytes) {
			/* Zip archives have end-of-archive markers
			   that are longer than this, so a failure to get at
			   least 24 bytes really does indicate a truncated
			   file. */
			archive_set_error(&a->archive,
			    ARCHIVE_ERRNO_FILE_FORMAT,
			    "Truncated ZIP file data");
			return (ARCHIVE_FATAL);
		}
		/* Check for a complete PK\007\010 signature, followed
		 * by the correct 4-byte CRC. */
		p = buff + trailing_extra;
		if (p[0] == 'P' && p[1] == 'K'
		    && p[2] == '\007' && p[3] == '\010'
		    && (archive_le32dec(p + 4) == zip->computed_crc32
			|| zip->ignore_crc32
			|| (zip->hctx_valid
			 && zip->entry->aes_extra.vendor == AES_VENDOR_AE_2))) {
			zip->end_of_entry = 1;
			if (zip->hctx_valid) {
				r = check_authentication_code(a, buff);
				if (r != ARCHIVE_OK)
					return (r);
			}
			return (ARCHIVE_OK);
		}
		/* If not at EOF, ensure we consume at least one byte. */
		++p;

		/* Scan forward until we see where a PK\007\010 signature
		 * might be. */
		/* Return bytes up until that point.  On the next call,
		 * the code above will verify the data descriptor. */
		while (p < buff + bytes_avail - 4) {
			if (p[3] == 'P') { p += 3; }
			else if (p[3] == 'K') { p += 2; }
			else if (p[3] == '\007') { p += 1; }
			else if (p[3] == '\010' && p[2] == '\007'
			    && p[1] == 'K' && p[0] == 'P') {
				break;
			} else { p += 4; }
		}
		p -= trailing_extra;
		bytes_avail = p - buff;
	} else {
		if (zip->entry_bytes_remaining == 0) {
			zip->end_of_entry = 1;
			if (zip->hctx_valid) {
				r = check_authentication_code(a, NULL);
				if (r != ARCHIVE_OK)
					return (r);
			}
			return (ARCHIVE_OK);
		}
		/* Grab a bunch of bytes. */
		buff = __archive_read_ahead(a, 1, &bytes_avail);
		if (bytes_avail <= 0) {
			archive_set_error(&a->archive,
			    ARCHIVE_ERRNO_FILE_FORMAT,
			    "Truncated ZIP file data");
			return (ARCHIVE_FATAL);
		}
		if (bytes_avail > zip->entry_bytes_remaining)
			bytes_avail = (ssize_t)zip->entry_bytes_remaining;
	}
	if (zip->tctx_valid || zip->cctx_valid) {
		size_t dec_size = bytes_avail;

		if (dec_size > zip->decrypted_buffer_size)
			dec_size = zip->decrypted_buffer_size;
		if (zip->tctx_valid) {
			trad_enc_decrypt_update(&zip->tctx,
			    (const uint8_t *)buff, dec_size,
			    zip->decrypted_buffer, dec_size);
		} else {
			size_t dsize = dec_size;
			archive_hmac_sha1_update(&zip->hctx,
			    (const uint8_t *)buff, dec_size);
			archive_decrypto_aes_ctr_update(&zip->cctx,
			    (const uint8_t *)buff, dec_size,
			    zip->decrypted_buffer, &dsize);
		}
		bytes_avail = dec_size;
		buff = (const char *)zip->decrypted_buffer;
	}
	zip->entry_bytes_remaining -= bytes_avail;
	zip->entry_uncompressed_bytes_read += bytes_avail;
	zip->entry_compressed_bytes_read += bytes_avail;
	zip->unconsumed += bytes_avail;
	*size = bytes_avail;
	*_buff = buff;
	return (ARCHIVE_OK);
}